

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O2

yajl_tok yajl_lex_lex(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset,
                     uchar **outBuf,size_t *outLen)

{
  size_t *psVar1;
  bool bVar2;
  uchar uVar3;
  size_t sVar4;
  uchar *puVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  byte bVar9;
  size_t *psVar10;
  yajl_lex_error yVar11;
  int iVar12;
  yajl_tok yVar13;
  long lVar14;
  size_t local_50;
  
  local_50 = *offset;
  *outBuf = (uchar *)0x0;
  *outLen = 0;
  psVar1 = &lexer->bufOff;
  while (*offset < jsonTextLen) {
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    uVar3 = puVar5[sVar4];
    switch(uVar3) {
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case ' ':
      local_50 = local_50 + 1;
      break;
    case '\"':
      yVar13 = yajl_tok_string;
      goto LAB_0010347e;
    case ',':
      yVar13 = yajl_tok_comma;
      goto LAB_00103b30;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      if (*offset == 0) {
        *psVar1 = *psVar1 - 1;
        uVar6 = *offset;
      }
      else {
        uVar6 = *offset - 1;
        *offset = uVar6;
      }
      if (jsonTextLen <= uVar6) goto LAB_00103c24;
      puVar5 = jsonText;
      psVar10 = offset;
      if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
         (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
        puVar5 = yajl_buf_data(lexer->buf);
        psVar10 = psVar1;
      }
      sVar4 = *psVar10;
      *psVar10 = sVar4 + 1;
      uVar3 = puVar5[sVar4];
      if (uVar3 == '-') {
        if (jsonTextLen <= *offset) goto LAB_00103c24;
        puVar5 = jsonText;
        psVar10 = offset;
        if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
           (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
          puVar5 = yajl_buf_data(lexer->buf);
          psVar10 = psVar1;
        }
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
        uVar3 = puVar5[sVar4];
      }
      if (uVar3 != '0') {
        if ((byte)(uVar3 - 0x31) < 9) goto LAB_0010336d;
        sVar4 = *offset;
        psVar10 = offset;
        if (sVar4 == 0) {
          sVar4 = *psVar1;
          psVar10 = psVar1;
        }
        *psVar10 = sVar4 - 1;
        lexer->error = yajl_lex_missing_integer_after_minus;
        goto LAB_00103b2d;
      }
      if (*offset < jsonTextLen) {
        puVar5 = jsonText;
        psVar10 = offset;
        if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
           (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
          puVar5 = yajl_buf_data(lexer->buf);
          psVar10 = psVar1;
        }
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
        bVar9 = puVar5[sVar4];
        goto LAB_001033d7;
      }
      goto LAB_00103c24;
    case '/':
      uVar6 = *offset;
      if (lexer->allowComments == 0) {
        psVar10 = offset;
        if (uVar6 == 0) {
          uVar6 = *psVar1;
          psVar10 = psVar1;
        }
        *psVar10 = uVar6 - 1;
        lexer->error = yajl_lex_unallowed_comment;
        goto LAB_00103852;
      }
      if (jsonTextLen <= uVar6) goto LAB_00103c24;
      puVar5 = jsonText;
      psVar10 = offset;
      if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
         (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
        puVar5 = yajl_buf_data(lexer->buf);
        psVar10 = psVar1;
      }
      sVar4 = *psVar10;
      *psVar10 = sVar4 + 1;
      if (puVar5[sVar4] == '/') {
        do {
          if (jsonTextLen <= *offset) goto LAB_00103c24;
          puVar5 = jsonText;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
             (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
            puVar5 = yajl_buf_data(lexer->buf);
            psVar10 = psVar1;
          }
          sVar4 = *psVar10;
          *psVar10 = sVar4 + 1;
        } while (puVar5[sVar4] != '\n');
        goto LAB_0010311b;
      }
      if (puVar5[sVar4] != '*') {
        lexer->error = yajl_lex_invalid_char;
        goto LAB_00103b2d;
      }
      while( true ) {
        do {
          if (jsonTextLen <= *offset) goto LAB_00103c24;
          puVar5 = jsonText;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
             (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
            puVar5 = yajl_buf_data(lexer->buf);
            psVar10 = psVar1;
          }
          sVar4 = *psVar10;
          *psVar10 = sVar4 + 1;
        } while (puVar5[sVar4] != '*');
        if (jsonTextLen <= *offset) goto LAB_00103c24;
        puVar5 = jsonText;
        psVar10 = offset;
        if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
           (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
          puVar5 = yajl_buf_data(lexer->buf);
          psVar10 = psVar1;
        }
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
        if (puVar5[sVar4] == '/') break;
        sVar4 = *offset;
        psVar10 = offset;
        if (sVar4 == 0) {
          sVar4 = *psVar1;
          psVar10 = psVar1;
        }
        *psVar10 = sVar4 - 1;
      }
LAB_0010311b:
      yajl_buf_clear(lexer->buf);
      lexer->bufInUse = 0;
      local_50 = *offset;
      break;
    case ':':
      yVar13 = yajl_tok_colon;
      goto LAB_00103b30;
    default:
      if (uVar3 == '[') {
        yVar13 = yajl_tok_left_brace;
        goto LAB_00103b30;
      }
      if (uVar3 == ']') {
        yVar13 = yajl_tok_right_brace;
        goto LAB_00103b30;
      }
      if (uVar3 == 'f') {
        lVar14 = 0;
        goto LAB_00103900;
      }
      if (uVar3 == '}') {
        yVar13 = yajl_tok_right_bracket;
        goto LAB_00103b30;
      }
      if (uVar3 == 't') {
        lVar14 = 0;
        goto LAB_0010386a;
      }
      if (uVar3 == '{') {
        yVar13 = yajl_tok_left_bracket;
        goto LAB_00103b30;
      }
      if (uVar3 == 'n') {
        lVar14 = 0;
        yVar13 = yajl_tok_null;
        goto LAB_00103195;
      }
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x16':
    case '\x17':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
    case '\x1c':
    case '\x1d':
    case '\x1e':
    case '\x1f':
    case '!':
    case '#':
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case '.':
      lexer->error = yajl_lex_invalid_char;
LAB_00103852:
      yVar13 = yajl_tok_error;
      goto LAB_00103b30;
    }
  }
  goto LAB_00103c24;
  while( true ) {
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    if ((uint)puVar5[sVar4] != (int)"alse"[lVar14]) goto LAB_00103b02;
    lVar14 = lVar14 + 1;
    yVar13 = yajl_tok_bool;
    if (lVar14 == 4) break;
LAB_00103900:
    if (jsonTextLen <= *offset) goto LAB_00103c24;
  }
  goto LAB_00103b30;
  while( true ) {
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    if ((uint)puVar5[sVar4] != (int)"rue"[lVar14]) goto LAB_00103b02;
    lVar14 = lVar14 + 1;
    yVar13 = yajl_tok_bool;
    if (lVar14 == 3) break;
LAB_0010386a:
    if (jsonTextLen <= *offset) goto LAB_00103c24;
  }
  goto LAB_00103b30;
LAB_00103b02:
  sVar4 = *offset;
  psVar10 = offset;
  if (sVar4 == 0) {
    sVar4 = *psVar1;
    psVar10 = psVar1;
  }
  *psVar10 = sVar4 - 1;
  lexer->error = yajl_lex_invalid_string;
LAB_00103b2d:
  yVar13 = yajl_tok_error;
  goto LAB_00103b30;
  while (lVar14 = lVar14 + 1, lVar14 != 3) {
LAB_00103195:
    if (jsonTextLen <= *offset) goto LAB_00103c24;
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    if ((uint)puVar5[sVar4] != (int)"ull"[lVar14]) {
      sVar4 = *offset;
      yVar13 = yajl_tok_error;
      psVar10 = offset;
      if (sVar4 == 0) {
        sVar4 = *psVar1;
        psVar10 = psVar1;
      }
      *psVar10 = sVar4 - 1;
      lexer->error = yajl_lex_invalid_string;
      break;
    }
  }
  goto LAB_00103b30;
  while( true ) {
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    bVar9 = puVar5[sVar4];
    if (9 < (byte)(bVar9 - 0x30)) break;
LAB_0010336d:
    if (jsonTextLen <= *offset) goto LAB_00103c24;
  }
LAB_001033d7:
  uVar6 = *offset;
  if (bVar9 != 0x2e) {
    yVar13 = yajl_tok_integer;
LAB_0010399a:
    if ((bVar9 & 0xdf) == 0x45) {
      if (jsonTextLen <= uVar6) goto LAB_00103c24;
      puVar5 = jsonText;
      psVar10 = offset;
      if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
         (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
        puVar5 = yajl_buf_data(lexer->buf);
        psVar10 = psVar1;
      }
      sVar4 = *psVar10;
      *psVar10 = sVar4 + 1;
      uVar3 = puVar5[sVar4];
      if ((uVar3 == '-') || (uVar3 == '+')) {
        if (jsonTextLen <= *offset) goto LAB_00103c24;
        puVar5 = jsonText;
        psVar10 = offset;
        if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
           (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
          puVar5 = yajl_buf_data(lexer->buf);
          psVar10 = psVar1;
        }
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
        uVar3 = puVar5[sVar4];
      }
      if (9 < (byte)(uVar3 - 0x30)) {
        sVar4 = *offset;
        psVar10 = offset;
        if (sVar4 == 0) {
          sVar4 = *psVar1;
          psVar10 = psVar1;
        }
        *psVar10 = sVar4 - 1;
        lexer->error = yajl_lex_missing_integer_after_exponent;
LAB_00103d1c:
        yVar13 = yajl_tok_error;
        goto LAB_00103b30;
      }
      yVar13 = yajl_tok_double;
      do {
        if (jsonTextLen <= *offset) goto LAB_00103c24;
        puVar5 = jsonText;
        psVar10 = offset;
        if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
           (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
          puVar5 = yajl_buf_data(lexer->buf);
          psVar10 = psVar1;
        }
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
      } while ((byte)(puVar5[sVar4] - 0x30) < 10);
      uVar6 = *offset;
    }
    if (uVar6 == 0) {
      *psVar1 = *psVar1 - 1;
    }
    else {
      *offset = uVar6 - 1;
    }
    goto LAB_00103b30;
  }
  if (uVar6 < jsonTextLen) {
    iVar12 = 0;
    puVar5 = jsonText;
    psVar10 = offset;
    if (lexer->bufInUse == 0) goto LAB_00103bcd;
    sVar4 = yajl_buf_len(lexer->buf);
    iVar12 = 0;
    if (sVar4 == 0) goto LAB_00103bcd;
    uVar6 = lexer->bufOff;
    sVar4 = yajl_buf_len(lexer->buf);
    iVar12 = 0;
    if (sVar4 <= uVar6) goto LAB_00103bcd;
    do {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
LAB_00103bcd:
      do {
        iVar12 = iVar12 + 1;
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
        bVar9 = puVar5[sVar4];
        uVar6 = *offset;
        if (9 < (byte)(bVar9 - 0x30)) {
          if (iVar12 != 1) {
            yVar13 = yajl_tok_double;
            goto LAB_0010399a;
          }
          psVar10 = offset;
          if (uVar6 == 0) {
            uVar6 = *psVar1;
            psVar10 = psVar1;
          }
          *psVar10 = uVar6 - 1;
          lexer->error = yajl_lex_missing_integer_after_decimal;
          goto LAB_00103d1c;
        }
        if (jsonTextLen <= uVar6) goto LAB_00103c24;
        puVar5 = jsonText;
        psVar10 = offset;
      } while (((lexer->bufInUse == 0) || (sVar4 = yajl_buf_len(lexer->buf), sVar4 == 0)) ||
              (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), sVar4 <= uVar6));
    } while( true );
  }
LAB_00103c24:
  bVar2 = true;
  yVar13 = yajl_tok_eof;
  if (lexer->bufInUse == 0) {
    yajl_buf_clear(lexer->buf);
  }
  goto LAB_00103c3a;
  while (yVar13 = yajl_tok_string_with_escapes,
        ("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
         [puVar5[sVar4]] & 1U) != 0) {
LAB_0010347e:
    if (((lexer->bufInUse == 0) || (sVar4 = yajl_buf_len(lexer->buf), sVar4 == 0)) ||
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), sVar4 <= uVar6)) {
      sVar4 = *offset;
      if (sVar4 <= jsonTextLen && jsonTextLen - sVar4 != 0) {
        sVar8 = yajl_string_scan(jsonText + sVar4,jsonTextLen - sVar4,lexer->validateUTF8);
        sVar4 = sVar4 + sVar8;
        *offset = sVar4;
      }
    }
    else {
      puVar5 = yajl_buf_data(lexer->buf);
      sVar4 = lexer->bufOff;
      sVar7 = yajl_buf_len(lexer->buf);
      sVar8 = lexer->bufOff;
      sVar4 = yajl_string_scan(puVar5 + sVar4,sVar7 - sVar8,lexer->validateUTF8);
      lexer->bufOff = sVar4 + sVar8;
      sVar4 = *offset;
    }
    if (jsonTextLen <= sVar4) goto LAB_00103c24;
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    bVar9 = puVar5[sVar4];
    if ((ulong)bVar9 == 0x22) goto LAB_00103b30;
    if (bVar9 != 0x5c) {
      if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
           [bVar9] & 2U) != 0) {
        sVar4 = *offset;
        yVar11 = yajl_lex_string_invalid_json_char;
        goto LAB_00103b9b;
      }
      if ((lexer->validateUTF8 != 0) && ((char)bVar9 < '\0')) {
        if ((bVar9 & 0xe0) == 0xc0) {
          if (jsonTextLen <= *offset) goto LAB_00103c24;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
             (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
            yajl_buf_data(lexer->buf);
            psVar10 = psVar1;
          }
          *psVar10 = *psVar10 + 1;
        }
        else if ((bVar9 & 0xf0) == 0xe0) {
          if (jsonTextLen <= *offset) goto LAB_00103c24;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
             (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
            yajl_buf_data(lexer->buf);
            psVar10 = psVar1;
          }
          *psVar10 = *psVar10 + 1;
        }
        else if ((bVar9 & 0xf8) == 0xf0) {
          if (jsonTextLen <= *offset) goto LAB_00103c24;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
             (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
            yajl_buf_data(lexer->buf);
            psVar10 = psVar1;
          }
          *psVar10 = *psVar10 + 1;
        }
        yVar11 = yajl_lex_string_invalid_utf8;
        goto LAB_00103cea;
      }
      goto LAB_0010347e;
    }
    if (jsonTextLen <= *offset) goto LAB_00103c24;
    puVar5 = jsonText;
    psVar10 = offset;
    if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
       (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
      puVar5 = yajl_buf_data(lexer->buf);
      psVar10 = psVar1;
    }
    sVar4 = *psVar10;
    *psVar10 = sVar4 + 1;
    if ((ulong)puVar5[sVar4] == 0x75) {
      iVar12 = 5;
      while (iVar12 = iVar12 + -1, iVar12 != 0) {
        if (jsonTextLen <= *offset) goto LAB_00103c24;
        puVar5 = jsonText;
        psVar10 = offset;
        if (((lexer->bufInUse != 0) && (sVar4 = yajl_buf_len(lexer->buf), sVar4 != 0)) &&
           (uVar6 = lexer->bufOff, sVar4 = yajl_buf_len(lexer->buf), uVar6 < sVar4)) {
          puVar5 = yajl_buf_data(lexer->buf);
          psVar10 = psVar1;
        }
        sVar4 = *psVar10;
        *psVar10 = sVar4 + 1;
        if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
             [puVar5[sVar4]] & 4U) == 0) {
          sVar4 = *offset;
          yVar11 = yajl_lex_string_invalid_hex_char;
          goto LAB_00103b9b;
        }
      }
      yVar13 = yajl_tok_string_with_escapes;
      goto LAB_0010347e;
    }
  }
  sVar4 = *offset;
  yVar11 = yajl_lex_string_invalid_escaped_char;
LAB_00103b9b:
  psVar10 = offset;
  if (sVar4 == 0) {
    sVar4 = *psVar1;
    psVar10 = psVar1;
  }
  *psVar10 = sVar4 - 1;
LAB_00103cea:
  yVar13 = yajl_tok_error;
  lexer->error = yVar11;
LAB_00103b30:
  if (lexer->bufInUse == 0) {
    if (yVar13 == yajl_tok_error) {
      return yajl_tok_error;
    }
    *outBuf = jsonText + local_50;
    *outLen = *offset - local_50;
  }
  else {
    bVar2 = false;
LAB_00103c3a:
    lexer->bufInUse = 1;
    yajl_buf_append(lexer->buf,jsonText + local_50,*offset - local_50);
    lexer->bufOff = 0;
    if (!bVar2) {
      puVar5 = yajl_buf_data(lexer->buf);
      *outBuf = puVar5;
      sVar4 = yajl_buf_len(lexer->buf);
      *outLen = sVar4;
      lexer->bufInUse = 0;
    }
  }
  if ((yVar13 & ~yajl_tok_colon) == yajl_tok_string) {
    *outBuf = *outBuf + 1;
    *outLen = *outLen - 2;
  }
  return yVar13;
}

Assistant:

yajl_tok
yajl_lex_lex(yajl_lexer lexer, const unsigned char * jsonText,
             size_t jsonTextLen, size_t * offset,
             const unsigned char ** outBuf, size_t * outLen)
{
    yajl_tok tok = yajl_tok_error;
    unsigned char c;
    size_t startOffset = *offset;

    *outBuf = NULL;
    *outLen = 0;

    for (;;) {
        assert(*offset <= jsonTextLen);

        if (*offset >= jsonTextLen) {
            tok = yajl_tok_eof;
            goto lexed;
        }

        c = readChar(lexer, jsonText, offset);

        switch (c) {
            case '{':
                tok = yajl_tok_left_bracket;
                goto lexed;
            case '}':
                tok = yajl_tok_right_bracket;
                goto lexed;
            case '[':
                tok = yajl_tok_left_brace;
                goto lexed;
            case ']':
                tok = yajl_tok_right_brace;
                goto lexed;
            case ',':
                tok = yajl_tok_comma;
                goto lexed;
            case ':':
                tok = yajl_tok_colon;
                goto lexed;
            case '\t': case '\n': case '\v': case '\f': case '\r': case ' ':
                startOffset++;
                break;
            case 't': {
                const char * want = "rue";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'f': {
                const char * want = "alse";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'n': {
                const char * want = "ull";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_null;
                goto lexed;
            }
            case '"': {
                tok = yajl_lex_string(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '-':
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9': {
                /* integer parsing wants to start from the beginning */
                unreadChar(lexer, offset);
                tok = yajl_lex_number(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '/':
                /* hey, look, a probable comment!  If comments are disabled
                 * it's an error. */
                if (!lexer->allowComments) {
                    unreadChar(lexer, offset);
                    lexer->error = yajl_lex_unallowed_comment;
                    tok = yajl_tok_error;
                    goto lexed;
                }
                /* if comments are enabled, then we should try to lex
                 * the thing.  possible outcomes are
                 * - successful lex (tok_comment, which means continue),
                 * - malformed comment opening (slash not followed by
                 *   '*' or '/') (tok_error)
                 * - eof hit. (tok_eof) */
                tok = yajl_lex_comment(lexer, (const unsigned char *) jsonText,
                                       jsonTextLen, offset);
                if (tok == yajl_tok_comment) {
                    /* "error" is silly, but that's the initial
                     * state of tok.  guilty until proven innocent. */
                    tok = yajl_tok_error;
                    yajl_buf_clear(lexer->buf);
                    lexer->bufInUse = 0;
                    startOffset = *offset;
                    break;
                }
                /* hit error or eof, bail */
                goto lexed;
            default:
                lexer->error = yajl_lex_invalid_char;
                tok = yajl_tok_error;
                goto lexed;
        }
    }


  lexed:
    /* need to append to buffer if the buffer is in use or
     * if it's an EOF token */
    if (tok == yajl_tok_eof || lexer->bufInUse) {
        if (!lexer->bufInUse) yajl_buf_clear(lexer->buf);
        lexer->bufInUse = 1;
        yajl_buf_append(lexer->buf, jsonText + startOffset, *offset - startOffset);
        lexer->bufOff = 0;

        if (tok != yajl_tok_eof) {
            *outBuf = yajl_buf_data(lexer->buf);
            *outLen = yajl_buf_len(lexer->buf);
            lexer->bufInUse = 0;
        }
    } else if (tok != yajl_tok_error) {
        *outBuf = jsonText + startOffset;
        *outLen = *offset - startOffset;
    }

    /* special case for strings. skip the quotes. */
    if (tok == yajl_tok_string || tok == yajl_tok_string_with_escapes)
    {
        assert(*outLen >= 2);
        (*outBuf)++;
        *outLen -= 2;
    }


#ifdef YAJL_LEXER_DEBUG
    if (tok == yajl_tok_error) {
        printf("lexical error: %s\n",
               yajl_lex_error_to_string(yajl_lex_get_error(lexer)));
    } else if (tok == yajl_tok_eof) {
        printf("EOF hit\n");
    } else {
        printf("lexed %s: '", tokToStr(tok));
        fwrite(*outBuf, 1, *outLen, stdout);
        printf("'\n");
    }
#endif

    return tok;
}